

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeFormatting.cpp
# Opt level: O3

void write_unsigned<unsigned_long_long>
               (raw_ostream *S,unsigned_long_long N,size_t MinDigits,IntegerStyle Style,
               bool IsNegative)

{
  char *pcVar1;
  bool bVar2;
  byte *__n;
  char *pcVar3;
  void *__buf;
  void *extraout_RDX;
  void *extraout_RDX_00;
  long lVar4;
  void *__buf_00;
  size_t I;
  void *pvVar5;
  ArrayRef<char> Buffer;
  char NumberBuffer [128];
  char acStack_40 [16];
  
  if (N >> 0x20 != 0) {
    builtin_strncpy(acStack_40,"00000000",8);
    __n = (byte *)(acStack_40 + 7);
    lVar4 = 0;
    do {
      lVar4 = lVar4 + 0x100000000;
      __buf = (void *)(N / 10);
      *__n = (char)N + (char)__buf * -10 | 0x30;
      __n = __n + -1;
      bVar2 = (void *)0x9 < N;
      N = (unsigned_long_long)__buf;
    } while (bVar2);
    __buf_00 = (void *)(lVar4 >> 0x20);
    if (IsNegative) {
      pcVar3 = S->OutBufCur;
      if (pcVar3 < S->OutBufEnd) {
        __n = (byte *)(pcVar3 + 1);
        S->OutBufCur = (char *)__n;
        *pcVar3 = '-';
      }
      else {
        llvm::raw_ostream::write(S,0x2d,__buf,(size_t)__n);
        __buf = extraout_RDX;
      }
    }
    pcVar3 = (char *)CONCAT71((int7)((ulong)__n >> 8),Style == Number || MinDigits <= __buf_00);
    pvVar5 = __buf_00;
    if (Style != Number && MinDigits > __buf_00) {
      do {
        pcVar1 = S->OutBufCur;
        if (pcVar1 < S->OutBufEnd) {
          pcVar3 = pcVar1 + 1;
          S->OutBufCur = pcVar3;
          *pcVar1 = '0';
        }
        else {
          llvm::raw_ostream::write(S,0x30,__buf,(size_t)pcVar3);
          __buf = extraout_RDX_00;
        }
        pvVar5 = (void *)((long)pvVar5 + 1);
      } while (pvVar5 < MinDigits);
    }
    if (Style == Number) {
      Buffer.Length = (size_type)__buf_00;
      Buffer.Data = acStack_40 + (8 - (long)__buf_00);
      writeWithCommas(S,Buffer);
    }
    else {
      llvm::raw_ostream::write(S,(int)(acStack_40 + (8 - (long)__buf_00)),__buf_00,(size_t)pcVar3);
    }
    return;
  }
  write_unsigned_impl<unsigned_int>(S,(uint)N,MinDigits,Style,IsNegative);
  return;
}

Assistant:

static void write_unsigned(raw_ostream &S, T N, size_t MinDigits,
                           IntegerStyle Style, bool IsNegative = false) {
  // Output using 32-bit div/mod if possible.
  if (N == static_cast<uint32_t>(N))
    write_unsigned_impl(S, static_cast<uint32_t>(N), MinDigits, Style,
                        IsNegative);
  else
    write_unsigned_impl(S, N, MinDigits, Style, IsNegative);
}